

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

Relation dg::vr::RelationsAnalyzer::ICMPToRel(ICmpInst *icmp,bool assumption)

{
  int iVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,assumption) == 0) {
    iVar1 = llvm::CmpInst::getInversePredicate
                      (*(ushort *)(icmp + 0x12) &
                       (FIRST_ICMP_PREDICATE|BAD_FCMP_PREDICATE|FCMP_TRUE));
  }
  else {
    iVar1 = llvm::ICmpInst::getSignedPredicate
                      (*(ushort *)(icmp + 0x12) &
                       (FIRST_ICMP_PREDICATE|BAD_FCMP_PREDICATE|FCMP_TRUE));
  }
  if (iVar1 - 0x20U < 10) {
    return *(Relation *)(&DAT_0012e0a4 + (ulong)(iVar1 - 0x20U) * 4);
  }
  abort();
}

Assistant:

RelationsAnalyzer::Relation
RelationsAnalyzer::ICMPToRel(const llvm::ICmpInst *icmp, bool assumption) {
    llvm::ICmpInst::Predicate pred = assumption ? icmp->getSignedPredicate()
                                                : icmp->getInversePredicate();

    switch (pred) {
    case llvm::ICmpInst::Predicate::ICMP_EQ:
        return Relation::EQ;
    case llvm::ICmpInst::Predicate::ICMP_NE:
        return Relation::NE;
    case llvm::ICmpInst::Predicate::ICMP_ULE:
        return Relation::ULE;
    case llvm::ICmpInst::Predicate::ICMP_SLE:
        return Relation::SLE;
    case llvm::ICmpInst::Predicate::ICMP_ULT:
        return Relation::ULT;
    case llvm::ICmpInst::Predicate::ICMP_SLT:
        return Relation::SLT;
    case llvm::ICmpInst::Predicate::ICMP_UGE:
        return Relation::UGE;
    case llvm::ICmpInst::Predicate::ICMP_SGE:
        return Relation::SGE;
    case llvm::ICmpInst::Predicate::ICMP_UGT:
        return Relation::UGT;
    case llvm::ICmpInst::Predicate::ICMP_SGT:
        return Relation::SGT;
    default:
#ifndef NDEBUG
        llvm::errs() << "Unhandled predicate in" << *icmp << "\n";
#endif
        abort();
    }
}